

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O2

void __thiscall CardProdNoAllocation::test_method(CardProdNoAllocation *this)

{
  Index IVar1;
  Index IVar2;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> aRStack_638 [24];
  void *local_620;
  RandomReturnType local_610;
  void *local_5f8;
  void *local_5e8;
  VectorXd x;
  int r;
  Index repDim;
  Index dim;
  VectorXd p;
  VectorXd d;
  MatrixXd J1;
  VectorXd z;
  VectorXd y;
  MatrixXd H0;
  MatrixXd J2;
  MatrixXd J0;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_508 [24];
  void *local_4f0;
  MatrixXd H2;
  MatrixXd H1;
  CartesianProduct S;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_410 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_3f8 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_3e0 [24];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_3c8 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_3a0 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_378 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_350 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_328 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_300 [40];
  RealSpace R2;
  RealSpace R3;
  CartesianProduct R2R3R2;
  SO3<mnf::ExpMapMatrix> RotSpace;
  CartesianProduct SO3R2R3R2;
  
  r = 100;
  mnf::RealSpace::RealSpace(&R2,2);
  mnf::RealSpace::RealSpace(&R3,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&RotSpace);
  mnf::CartesianProduct::CartesianProduct(&R2R3R2,(Manifold *)&R2,(Manifold *)&R3);
  mnf::CartesianProduct::multiply((Manifold *)&R2R3R2);
  mnf::CartesianProduct::CartesianProduct(&SO3R2R3R2,&RotSpace.super_Manifold,(Manifold *)&R2R3R2);
  mnf::CartesianProduct::CartesianProduct(&S,(Manifold *)&SO3R2R3R2,&RotSpace.super_Manifold);
  dim = mnf::Manifold::dim();
  repDim = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random
            ((RandomReturnType *)&local_610,repDim);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_610);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random
            ((RandomReturnType *)&local_610,dim);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&p,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_610);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random
            ((RandomReturnType *)&local_610,repDim);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_610);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&z,&repDim);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&d,&dim);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_610,100,repDim);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&J0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_610);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>((Matrix<double,_1,_1,0,_1,_1> *)&J1,&r,&dim)
  ;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&J2,&r,&repDim);
  IVar1 = mnf::Manifold::dim();
  IVar2 = mnf::Manifold::dim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_610,IVar1,IVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_610);
  IVar1 = mnf::Manifold::dim();
  IVar2 = mnf::Manifold::dim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_610,IVar1,IVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_610);
  IVar1 = mnf::Manifold::dim();
  IVar2 = mnf::Manifold::dim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_610,IVar1,IVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_610);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_300,&J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&J0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::applyDiffRetractation(&S,local_300,&local_610,aRStack_638);
  free(local_620);
  free(local_5e8);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_328,&J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&J1,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::applyDiffPseudoLog0(&S,local_328,&local_610,aRStack_638);
  free(local_620);
  free(local_5e8);
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
  mnf::utils::set_is_malloc_allowed(false);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_3e0,&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0
            );
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&p,(type *)0x0);
  mnf::Manifold::retractation(&S,local_3e0,&local_610,aRStack_638);
  free(local_620);
  free(local_5f8);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_3f8,&d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0
            );
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::pseudoLog(&S,local_3f8,&local_610,aRStack_638);
  free(local_620);
  free(local_5f8);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_410,&d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0
            );
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::pseudoLog0(&S,local_410,&local_610);
  free(local_5f8);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_350,&J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&J0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::applyDiffRetractation(&S,local_350,&local_610,aRStack_638);
  free(local_620);
  free(local_5e8);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_378,&J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&J1,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::applyDiffPseudoLog0(&S,local_378,&local_610,aRStack_638);
  free(local_620);
  free(local_5e8);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_3a0,&H1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&H0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_508,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&p,(type *)0x0);
  mnf::Manifold::applyTransport(&S,local_3a0,&local_610,aRStack_638,local_508);
  free(local_4f0);
  free(local_620);
  free(local_5e8);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_3c8,&H2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_610,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&H0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (aRStack_638,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_508,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&p,(type *)0x0);
  mnf::Manifold::applyInvTransportOnTheRight(&S,local_3c8,&local_610,aRStack_638,local_508);
  free(local_4f0);
  free(local_620);
  free(local_5e8);
  mnf::utils::set_is_malloc_allowed(true);
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
  free(H2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(H1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(H0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(J0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  mnf::CartesianProduct::~CartesianProduct(&S);
  mnf::CartesianProduct::~CartesianProduct(&SO3R2R3R2);
  mnf::CartesianProduct::~CartesianProduct(&R2R3R2);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3(&RotSpace);
  mnf::RealSpace::~RealSpace(&R3);
  mnf::RealSpace::~RealSpace(&R2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdNoAllocation)
{
  // We only test here that the operations on the manifold do not create
  // temporary. Passing arguments that are not recognize by the Eigen::Ref will
  // create temporaries, but this is the user's fault.
  const int r = 100;
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct R2R3R2(R2, R3);
  R2R3R2.multiply(R2);
  CartesianProduct SO3R2R3R2(RotSpace, R2R3R2);
  CartesianProduct S(SO3R2R3R2, RotSpace);
  Index dim = S.dim();
  Index repDim = S.representationDim();
  Eigen::VectorXd x = Eigen::VectorXd::Random(repDim);
  Eigen::VectorXd p = Eigen::VectorXd::Random(dim);
  Eigen::VectorXd y = Eigen::VectorXd::Random(repDim);
  Eigen::VectorXd z(repDim);
  Eigen::VectorXd d(dim);
  Eigen::MatrixXd J0 = Eigen::MatrixXd::Random(r, repDim);
  Eigen::MatrixXd J1(r, dim);
  Eigen::MatrixXd J2(r, repDim);
  Eigen::MatrixXd H0 = Eigen::MatrixXd::Random(S.dim(), S.dim());
  Eigen::MatrixXd H1 = Eigen::MatrixXd::Random(S.dim(), S.dim());
  Eigen::MatrixXd H2 = Eigen::MatrixXd::Random(S.dim(), S.dim());

  // The first call to the following methods might trigger a memory allocation
  // depending on the size of the Ji and the initial buffer size inside S.
  // However, subsequent calls should not require any allocation, what we check
  // after.
  S.applyDiffRetractation(J1, J0, x);
  S.applyDiffPseudoLog0(J2, J1, x);

  Eigen::internal::set_is_malloc_allowed(false);
  utils::set_is_malloc_allowed(false);
  {
    S.retractation(z, x, p);
    S.pseudoLog(d, y, x);
    S.pseudoLog0(d, x);
    S.applyDiffRetractation(J1, J0, x);
    S.applyDiffPseudoLog0(J2, J1, x);
    S.applyTransport(H1, H0, x, p);
    S.applyInvTransportOnTheRight(H2, H0, x, p);
  }
  utils::set_is_malloc_allowed(true);
  Eigen::internal::set_is_malloc_allowed(true);
}